

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager.cc
# Opt level: O3

int filesystem::copy(path *from,path *to)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  pointer extraout_RAX;
  pointer pcVar3;
  ofstream dst;
  ifstream src;
  long *local_448 [2];
  long local_438 [2];
  long *local_428;
  filebuf local_420 [8];
  long local_418 [29];
  ios_base local_330 [264];
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [31];
  
  bVar1 = exists(from);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    bVar1 = exists(to);
    iVar2 = (int)CONCAT71(extraout_var_00,bVar1);
    if (!bVar1) {
      path::parent_path((path *)local_228,to);
      bVar1 = create_directories((path *)local_228);
      pcVar3 = local_228 + 0x10;
      if ((pointer)local_228._0_8_ != pcVar3) {
        operator_delete((void *)local_228._0_8_,local_218[0]._M_allocated_capacity + 1);
        pcVar3 = extraout_RAX;
      }
      iVar2 = (int)pcVar3;
      if (bVar1) {
        pcVar3 = (from->path_)._M_dataplus._M_p;
        local_428 = local_418;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_428,pcVar3,pcVar3 + (from->path_)._M_string_length);
        std::ifstream::ifstream(local_228,(string *)&local_428,_S_in);
        if (local_428 != local_418) {
          operator_delete(local_428,local_418[0] + 1);
        }
        pcVar3 = (to->path_)._M_dataplus._M_p;
        local_448[0] = local_438;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_448,pcVar3,pcVar3 + (to->path_)._M_string_length);
        std::ofstream::ofstream(&local_428,(string *)local_448,_S_out);
        if (local_448[0] != local_438) {
          operator_delete(local_448[0],local_438[0] + 1);
        }
        std::ostream::operator<<(&local_428,(streambuf *)(local_228 + 0x10));
        local_428 = _VTT;
        *(undefined8 *)(local_420 + _VTT[-3] + -8) = _operator__;
        std::filebuf::~filebuf(local_420);
        std::ios_base::~ios_base(local_330);
        iVar2 = std::ifstream::~ifstream(local_228);
      }
    }
  }
  return iVar2;
}

Assistant:

void ::filesystem::copy(const path& from, const path& to)
{
    if (!::filesystem::exists(from)) {
        return;
    }

    if (!::filesystem::exists(to)) {
        if (::filesystem::create_directories(to.parent_path())) {
            ifstream src(from.string());
            ofstream dst(to.string());

            dst << src.rdbuf();
        }
    }
}